

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
::_build_from_H(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
                *this,ID_index cellID,Tmp_column *column,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *chainsInH)

{
  Index *pIVar1;
  Column *column_00;
  Index *pIVar2;
  ID_index cellID_local;
  
  cellID_local = cellID;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)column,&cellID_local);
  pIVar1 = (chainsInH->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pIVar2 = (chainsInH->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_start; pIVar2 != pIVar1; pIVar2 = pIVar2 + 1) {
    column_00 = get_column(this,*pIVar2);
    _add_to(this,column_00,column,1);
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_build_from_H(ID_index cellID,
                                                       Tmp_column& column,
                                                       std::vector<Entry_representative>& chainsInH)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    column.insert(cellID);
    for (Index idx_h : chainsInH) {
      _add_to(get_column(idx_h), column, 1u);
    }
  } else {
    column.emplace(cellID, 1);
    for (std::pair<Index, Field_element>& idx_h : chainsInH) {
      _add_to(get_column(idx_h.first), column, idx_h.second);
    }
  }
}